

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

string * __thiscall Assimp::FIHexValueImpl::toString_abi_cxx11_(FIHexValueImpl *this)

{
  uint *puVar1;
  string asStack_1a8 [32];
  ostringstream os;
  uint auStack_170 [88];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    *(uint *)((long)auStack_170 + *(long *)(_os + -0x18)) =
         *(uint *)((long)auStack_170 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_170 + *(long *)(_os + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    std::operator<<((ostringstream *)&os,0x30);
    std::
    for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Assimp::FIHexValueImpl::toString[abi:cxx11]()const::_lambda(unsigned_char)_1_>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(this->super_FIHexValue).super_FIByteValue.value.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(this->super_FIHexValue).super_FIByteValue.value.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&os);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,asStack_1a8);
    std::__cxx11::string::~string(asStack_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::for_each(value.begin(), value.end(), [&](uint8_t c) { os << std::setw(2) << static_cast<int>(c); });
            strValue = os.str();
        }
        return strValue;
    }